

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
hta::storage::file::Metric::find_index
          (Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  int64_t iVar4;
  long local_88;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_80;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_78;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_70;
  long local_68;
  int64_t index_end;
  int64_t index_begin;
  long local_50;
  int64_t sz;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_40;
  Metric *local_38;
  Metric *this_local;
  IntervalScope scope_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  local_38 = this;
  this_local = (Metric *)scope;
  scope_local = (IntervalScope)
                end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
  end_local = begin;
  bVar1 = std::chrono::operator>
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&scope_local);
  if (((bVar1) && ((int)this_local != 3)) && (this_local._4_4_ != 3)) {
    local_40.__d.__r =
         (duration)
         (duration)
         end_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    sz._0_4_ = scope_local.begin;
    sz._4_4_ = scope_local.end;
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("storage::file::Metric::find_index invalid request: begin timestamp ",
               (time_point)
               end_local.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",(time_point)scope_local);
  }
  iVar2 = (*(this->super_Metric)._vptr_Metric[10])();
  local_50 = CONCAT44(extraout_var,iVar2);
  if (local_50 == 0) {
    index_begin._4_4_ = 0;
    index_begin._0_4_ = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)&begin_local,(int *)((long)&index_begin + 4),
               (int *)&index_begin);
  }
  else {
    index_end = -1;
    local_68 = -1;
    switch((ulong)this_local & 0xffffffff) {
    case 0:
      local_78.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      index_end = find_index_before_or_on(this,end_local,local_50);
      if (index_end < local_50) {
        index_end = index_end + 1;
      }
      break;
    case 1:
      local_70.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      index_end = find_index_on_or_after(this,end_local,local_50);
      break;
    case 2:
      local_80.__d.__r =
           (duration)
           (duration)
           end_local.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      index_end = find_index_before_or_on(this,end_local,local_50);
      local_88 = 0;
      plVar3 = std::max<long>(&index_end,&local_88);
      index_end = *plVar3;
      break;
    case 3:
      index_end = 0;
    }
    switch((ulong)this_local >> 0x20) {
    case 0:
      iVar4 = find_index_on_or_after(this,(TimePoint)scope_local,local_50);
      local_68 = iVar4 + -1;
      break;
    case 1:
      local_68 = find_index_before_or_on(this,(TimePoint)scope_local,local_50);
      break;
    case 2:
      local_68 = find_index_on_or_after(this,(TimePoint)scope_local,local_50);
      break;
    case 3:
      local_68 = local_50 + -1;
    }
    if (local_68 < local_50) {
      local_68 = local_68 + 1;
    }
    if (index_end < 0) {
      __assert_fail("index_begin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x140,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (local_50 < index_end) {
      __assert_fail("index_begin <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x141,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (local_68 < 0) {
      __assert_fail("index_end >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x142,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (local_50 < local_68) {
      __assert_fail("index_end <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x143,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (local_68 < index_end) {
      __assert_fail("index_begin <= index_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x144,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    std::pair<unsigned_long,_unsigned_long>::pair<long_&,_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&begin_local,&index_end,&local_68);
  }
  return _begin_local;
}

Assistant:

std::pair<uint64_t, uint64_t> Metric::find_index(TimePoint begin, TimePoint end,
                                                 IntervalScope scope)
{
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("storage::file::Metric::find_index invalid request: begin timestamp ",
                        begin, " larger than end timestamp ", end);
    }
    // Must be signed for comparision
    const auto sz = static_cast<int64_t>(size());
    if (sz == 0)
    {
        return { 0, 0 };
    }

    // We initialize so we don't get uninitialized
    int64_t index_begin = -1;
    /* this is the index of the end _element_ (not after!) according to scope.end
     * It may be out of scope (==size()) in some cases */
    int64_t index_end = -1;
    // This is quite complex and possibly bad for performance
    // TODO optimize // simplify
    switch (scope.begin)
    {
    case Scope::closed:
        index_begin = find_index_on_or_after(begin, sz);
        break;
    case Scope::open:
        index_begin = find_index_before_or_on(begin, sz);
        if (index_begin < sz)
        {
            index_begin++;
        }
        break;
    case Scope::extended:
        index_begin = find_index_before_or_on(begin, sz);
        index_begin = std::max<decltype(index_begin)>(index_begin, 0);
        break;
    case Scope::infinity:
        index_begin = 0;
        break;
    }

    switch (scope.end)
    {
    case Scope::closed:
        index_end = find_index_before_or_on(end, sz);
        break;
    case Scope::open:
        index_end = find_index_on_or_after(end, sz);
        index_end--;
        break;
    case Scope::extended:
        index_end = find_index_on_or_after(end, sz);
        break;
    case Scope::infinity:
        index_end = sz - 1;
        break;
    }
    // Move index_end to *after* the last included element... if not already outside.
    if (index_end < sz)
    {
        index_end++;
    }

    assert(index_begin >= 0);
    assert(index_begin <= sz);
    assert(index_end >= 0);
    assert(index_end <= sz);
    assert(index_begin <= index_end);

    return { index_begin, index_end };
}